

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O2

void duckdb::StringAggSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  StringAggBindData *pSVar1;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  StringAggBindData bind_data;
  
  bind_data_p_local = bind_data_p;
  pSVar1 = (StringAggBindData *)
           optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  StringAggBindData::StringAggBindData(&bind_data,pSVar1);
  Serializer::WriteProperty<std::__cxx11::string>(serializer,100,"separator",&bind_data.sep);
  StringAggBindData::~StringAggBindData(&bind_data);
  return;
}

Assistant:

static void StringAggSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                               const AggregateFunction &function) {
	auto bind_data = bind_data_p->Cast<StringAggBindData>();
	serializer.WriteProperty(100, "separator", bind_data.sep);
}